

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

void HSendPacket(int node,int len)

{
  PacketStore *pPVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined4 extraout_var;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  undefined1 local_36f8 [14024];
  
  uVar9 = (ulong)(uint)len;
  if (node != 0 && debugfile != (FILE *)0x0) {
    if ((doomcom.data[0] & 0x20) == 0) {
      if ((char)doomcom.data[0] < '\0') {
        fprintf((FILE *)debugfile,"%i/%i send %i = EXIT [%3i]",(ulong)(uint)gametic,
                (ulong)(uint)maketic,node,uVar9);
        if (0 < len) {
          uVar7 = 0;
          do {
            fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
      }
      else {
        uVar11 = (consoleplayer == Net_Arbitrator && NetMode == '\x01') | 2;
        uVar5 = 0xffffffff;
        if (0x3f < doomcom.data[0]) {
          uVar7 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
          iVar2 = ExpandTics((uint)doomcom.data[uVar7]);
          uVar5 = CONCAT44(extraout_var,iVar2);
        }
        iVar4 = gametic;
        iVar2 = maketic;
        __stream = debugfile;
        uVar6 = doomcom.data[0] & 3;
        if (uVar6 == 3) {
          uVar7 = (ulong)uVar11;
          uVar11 = uVar11 + 1;
          uVar6 = doomcom.data[uVar7] + 3;
        }
        uVar3 = ExpandTics((uint)doomcom.data[1]);
        fprintf((FILE *)__stream,"%i/%i send %i = (%i + %i, R %i) [%3i]",(ulong)(uint)iVar4,
                (ulong)(uint)iVar2,(ulong)(uint)node,(ulong)uVar3,(ulong)uVar6,uVar5,uVar9);
        if (0 < len) {
          uVar7 = 0;
          do {
            uVar5 = 0x20;
            if (uVar11 == uVar7) {
              uVar5 = 0x7c;
            }
            fprintf((FILE *)debugfile,"%c%2x",uVar5,(ulong)doomcom.data[uVar7]);
            uVar7 = uVar7 + 1;
          } while (uVar9 != uVar7);
        }
      }
    }
    else {
      fprintf((FILE *)debugfile,"%i/%i send %i = SETUP [%3i]",(ulong)(uint)gametic,
              (ulong)(uint)maketic,node,uVar9);
      if (0 < len) {
        uVar7 = 0;
        do {
          fprintf((FILE *)debugfile," %2x",(ulong)doomcom.data[uVar7]);
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
    }
    fwrite(" [[ ",4,1,(FILE *)debugfile);
    if (0 < doomcom.numnodes) {
      piVar10 = nettics;
      lVar8 = 0;
      do {
        if (nodeingame[lVar8] == true) {
          fprintf((FILE *)debugfile,"%d ",(ulong)(uint)*piVar10);
        }
        else {
          fwrite("--- ",4,1,(FILE *)debugfile);
        }
        lVar8 = lVar8 + 1;
        piVar10 = (int *)((uint *)piVar10 + 1);
      } while (lVar8 < doomcom.numnodes);
    }
    fwrite("]]\n",3,1,(FILE *)debugfile);
  }
  if (node == 0) {
    memcpy(reboundstore,doomcom.data,(long)len);
    reboundpacket = len;
  }
  else if (demoplayback == false) {
    if (netgame == false) {
      I_Error("Tried to transmit to another node");
    }
    doomcom.command = 1;
    doomcom.remotenode = (SWORD)node;
    doomcom.datalength = (SWORD)len;
    if (net_fakelatency.Value < 2) {
      I_NetCmd();
    }
    else {
      memcpy(local_36f8,&doomcom,0x36c4);
      iVar4 = (*I_GetTime)(false);
      iVar2 = net_fakelatency.Value / 0x38;
      TArray<PacketStore,_PacketStore>::Grow(&OutBuffer,1);
      pPVar1 = OutBuffer.Array + OutBuffer.Count;
      pPVar1->timer = iVar2 + iVar4;
      memcpy(&pPVar1->message,local_36f8,0x36c4);
      OutBuffer.Count = OutBuffer.Count + 1;
    }
    if (OutBuffer.Count != 0) {
      uVar9 = 0;
      do {
        uVar6 = (uint)uVar9;
        iVar2 = OutBuffer.Array[uVar9].timer;
        iVar4 = (*I_GetTime)(false);
        uVar11 = uVar6;
        if (iVar2 <= iVar4) {
          memcpy(&doomcom,&OutBuffer.Array[uVar9].message,0x36c4);
          I_NetCmd();
          uVar11 = 0xffffffff;
          if (uVar6 < OutBuffer.Count) {
            OutBuffer.Count = OutBuffer.Count - 1;
            if (uVar6 <= OutBuffer.Count && OutBuffer.Count - uVar6 != 0) {
              memmove(OutBuffer.Array + uVar9,OutBuffer.Array + (uVar6 + 1),
                      (ulong)(OutBuffer.Count - uVar6) * 0x36c8);
            }
          }
        }
        uVar9 = (ulong)(uVar11 + 1);
      } while (uVar11 + 1 < OutBuffer.Count);
    }
  }
  return;
}

Assistant:

void HSendPacket (int node, int len)
{
	if (debugfile && node != 0)
	{
		int i, k, realretrans;

		if (netbuffer[0] & NCMD_SETUP)
		{
			fprintf (debugfile,"%i/%i send %i = SETUP [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else if (netbuffer[0] & NCMD_EXIT)
		{
			fprintf (debugfile,"%i/%i send %i = EXIT [%3i]", gametic, maketic, node, len);
			for (i = 0; i < len; i++)
				fprintf (debugfile," %2x", ((BYTE *)netbuffer)[i]);
		}
		else
		{
			k = 2;

			if (NetMode == NET_PacketServer && consoleplayer == Net_Arbitrator &&
				node != 0)
			{
				k++;
			}

			if (netbuffer[0] & NCMD_RETRANSMIT)
				realretrans = ExpandTics (netbuffer[k++]);
			else
				realretrans = -1;

			int numtics = netbuffer[0] & 3;
			if (numtics == 3)
				numtics += netbuffer[k++];

			fprintf (debugfile,"%i/%i send %i = (%i + %i, R %i) [%3i]",
					gametic, maketic,
					node,
					ExpandTics(netbuffer[1]),
					numtics, realretrans, len);
			
			for (i = 0; i < len; i++)
				fprintf (debugfile, "%c%2x", i==k?'|':' ', ((BYTE *)netbuffer)[i]);
		}
		fprintf (debugfile, " [[ ");
		for (i = 0; i < doomcom.numnodes; ++i)
		{
			if (nodeingame[i])
			{
				fprintf (debugfile, "%d ", nettics[i]);
			}
			else
			{
				fprintf (debugfile, "--- ");
			}
		}
		fprintf (debugfile, "]]\n");
	}

	if (node == 0)
	{
		memcpy (reboundstore, netbuffer, len);
		reboundpacket = len;
		return;
	}

	if (demoplayback)
		return;

	if (!netgame)
		I_Error ("Tried to transmit to another node");

#if SIMULATEERRORS
	if (rand() < SIMULATEERRORS)
	{
		if (debugfile)
			fprintf (debugfile, "Drop!\n");
		return;
	}
#endif

	doomcom.command = CMD_SEND;
	doomcom.remotenode = node;
	doomcom.datalength = len;

#ifdef _DEBUG
	if (net_fakelatency / 2 > 0)
	{
		PacketStore store;
		store.message = doomcom;
		store.timer = I_GetTime(false) + ((net_fakelatency / 2) / (1000 / TICRATE));
		OutBuffer.Push(store);
	}
	else
		I_NetCmd();

	for (unsigned int i = 0; i < OutBuffer.Size(); i++)
	{
		if (OutBuffer[i].timer <= I_GetTime(false))
		{
			doomcom = OutBuffer[i].message;
			I_NetCmd();
			OutBuffer.Delete(i);
			i = -1;
		}
	}
#else
	I_NetCmd();
#endif
}